

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromise::ExtractSnapObjectDataInto
          (JavascriptPromise *this,SnapObject *objData,SlabAllocator *alloc)

{
  code *pcVar1;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *this_00;
  bool bVar2;
  PromiseStatus PVar3;
  int iVar4;
  uint dependsOnArrayCount;
  void **ppvVar5;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> **ppSVar6;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar7;
  SnapPromiseReactionInfo *pSVar8;
  undefined4 *puVar9;
  SListNodeBase<Memory::Recycler> **ppSVar10;
  Type *pTVar11;
  unsigned_long *dependsOnArray;
  Type *pTVar12;
  Iterator IVar13;
  uint local_bc;
  uint32 i_1;
  TTD_PTR_ID *depOnArray;
  uint32 depOnCount;
  uint32 i;
  Iterator it;
  void *local_90 [3];
  SnapPromiseInfo *local_78;
  SnapPromiseInfo *spi;
  List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> depOnList
  ;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  JavascriptPromise *this_local;
  SListNodeBase<Memory::Recycler> local_20;
  uint32 *local_18;
  bool local_9;
  
  depOnList._40_8_ = alloc;
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  List((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       &spi,&Memory::HeapAllocator::Instance,4);
  local_78 = TTD::SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseInfo>
                       ((SlabAllocatorBase<0> *)depOnList._40_8_);
  ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->result);
  local_78->Result = *ppvVar5;
  ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->result);
  if (*ppvVar5 != (void *)0x0) {
    ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->result);
    bVar2 = TTD::JsSupport::IsVarComplexKind(*ppvVar5);
    if (bVar2) {
      ppvVar5 = Memory::PointerValue<void>(&this->result);
      local_90[0] = *ppvVar5;
      JsUtil::
      List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
                ((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)&spi,(unsigned_long *)local_90);
    }
  }
  PVar3 = GetStatus(this);
  local_78->Status = (uint)PVar3;
  bVar2 = GetIsHandled(this);
  local_78->isHandled = bVar2;
  local_78->ResolveReactionCount = 0;
  ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SList__((WriteBarrierPtr *)&this->reactions);
  if (*ppSVar6 != (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
    pSVar7 = Memory::
             WriteBarrierPtr<SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>_>
             ::operator->(&this->reactions);
    it.current = (NodeBase *)&local_78;
    SListBase<Js::JavascriptPromiseReactionPair,Memory::Recycler,RealCount>::
    Map<Js::JavascriptPromise::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject*,TTD::SlabAllocatorBase<0>&)::__0>
              ((SListBase<Js::JavascriptPromiseReactionPair,Memory::Recycler,RealCount> *)pSVar7,
               (anon_class_8_1_ba1d790c_for_fn)it.current);
  }
  local_78->RejectReactionCount = local_78->ResolveReactionCount;
  local_78->ResolveReactions = (SnapPromiseReactionInfo *)0x0;
  local_78->RejectReactions = (SnapPromiseReactionInfo *)0x0;
  if (local_78->ResolveReactionCount != 0) {
    pSVar8 = TTD::SlabAllocatorBase<0>::
             SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>
                       ((SlabAllocatorBase<0> *)depOnList._40_8_,
                        (ulong)local_78->ResolveReactionCount);
    local_78->ResolveReactions = pSVar8;
    pSVar8 = TTD::SlabAllocatorBase<0>::
             SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>
                       ((SlabAllocatorBase<0> *)depOnList._40_8_,
                        (ulong)local_78->RejectReactionCount);
    local_78->RejectReactions = pSVar8;
    pSVar7 = Memory::
             WriteBarrierPtr<SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>_>
             ::operator->(&this->reactions);
    IVar13 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::GetIterator
                       (&pSVar7->
                         super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>
                       );
    depOnArray._4_4_ = 0;
    while( true ) {
      it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                IVar13.current;
      _depOnCount = IVar13.list;
      local_18 = &depOnCount;
      if (it.list ==
          (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        IVar13.current = &(it.list)->super_SListNodeBase<Memory::Recycler>;
        IVar13.list = _depOnCount;
        *puVar9 = 0;
      }
      it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                IVar13.current;
      _depOnCount = IVar13.list;
      this_00 = _depOnCount;
      SListNodeBase<Memory::Recycler>::Next(&local_20);
      ppSVar10 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                           ((WriteBarrierPtr *)&local_20);
      bVar2 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::IsHead
                        (this_00,*ppSVar10);
      if (bVar2) {
        it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0;
      }
      else {
        SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)&this_local);
        ppSVar10 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                             ((WriteBarrierPtr *)&this_local);
        it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                  *ppSVar10;
      }
      local_9 = !bVar2;
      if (!local_9) break;
      pTVar11 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator
                ::Data((Iterator *)&depOnCount);
      JavascriptPromiseReaction::ExtractSnapPromiseReactionInto
                (pTVar11->resolveReaction,local_78->ResolveReactions + depOnArray._4_4_,
                 (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)&spi,(SlabAllocator *)depOnList._40_8_);
      pTVar11 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator
                ::Data((Iterator *)&depOnCount);
      JavascriptPromiseReaction::ExtractSnapPromiseReactionInto
                (pTVar11->rejectReaction,local_78->RejectReactions + depOnArray._4_4_,
                 (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)&spi,(SlabAllocator *)depOnList._40_8_);
      IVar13.current = &(it.list)->super_SListNodeBase<Memory::Recycler>;
      IVar13.list = _depOnCount;
      depOnArray._4_4_ = depOnArray._4_4_ + 1;
    }
  }
  iVar4 = JsUtil::ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>::Count
                    ((ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer> *)&spi);
  if (iVar4 == 0) {
    TTD::NSSnapObjects::
    StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
              (objData,local_78);
  }
  else {
    dependsOnArrayCount =
         JsUtil::ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>::Count
                   ((ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer> *)&spi);
    dependsOnArray =
         TTD::SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>
                   ((SlabAllocatorBase<0> *)depOnList._40_8_,(ulong)dependsOnArrayCount);
    for (local_bc = 0; local_bc < dependsOnArrayCount; local_bc = local_bc + 1) {
      pTVar12 = JsUtil::
                List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)&spi,local_bc);
      dependsOnArray[local_bc] = *pTVar12;
    }
    TTD::NSSnapObjects::
    StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
              (objData,local_78,(SlabAllocator *)depOnList._40_8_,dependsOnArrayCount,dependsOnArray
              );
  }
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  ~List((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        &spi);
  return;
}

Assistant:

void JavascriptPromise::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        JsUtil::List<TTD_PTR_ID, HeapAllocator> depOnList(&HeapAllocator::Instance);

        TTD::NSSnapObjects::SnapPromiseInfo* spi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseInfo>();

        spi->Result = this->result;

        //Primitive kinds always inflated first so we only need to deal with complex kinds as depends on
        if(this->result != nullptr && TTD::JsSupport::IsVarComplexKind(this->result))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->result));
        }

        spi->Status = this->GetStatus();
        spi->isHandled = this->GetIsHandled();

        // get count of # of reactions
        spi->ResolveReactionCount = 0;
        if (this->reactions != nullptr)
        {
            this->reactions->Map([&spi](JavascriptPromiseReactionPair pair) {
                spi->ResolveReactionCount++;
            });
        }
        spi->RejectReactionCount = spi->ResolveReactionCount;

        // move resolve & reject reactions into slab
        spi->ResolveReactions = nullptr;
        spi->RejectReactions = nullptr;
        if(spi->ResolveReactionCount != 0)
        {
            spi->ResolveReactions = alloc.SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>(spi->ResolveReactionCount);
            spi->RejectReactions = alloc.SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>(spi->RejectReactionCount);

            JavascriptPromiseReactionList::Iterator it = this->reactions->GetIterator();
            uint32 i = 0;
            while (it.Next())
            {
                it.Data().resolveReaction->ExtractSnapPromiseReactionInto(spi->ResolveReactions + i, depOnList, alloc);
                it.Data().rejectReaction->ExtractSnapPromiseReactionInto(spi->RejectReactions + i, depOnList, alloc);
                ++i;
            }
        }

        //see what we need to do wrt dependencies
        if(depOnList.Count() == 0)
        {
            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseObject>(objData, spi);
        }
        else
        {
            uint32 depOnCount = depOnList.Count();
            TTD_PTR_ID* depOnArray = alloc.SlabAllocateArray<TTD_PTR_ID>(depOnCount);

            for(uint32 i = 0; i < depOnCount; ++i)
            {
                depOnArray[i] = depOnList.Item(i);
            }

            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseObject>(objData, spi, alloc, depOnCount, depOnArray);
        }
    }